

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

JavascriptArray * __thiscall
JsrtDebugStackFrames::StackFrames(JsrtDebugStackFrames *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  anon_class_24_3_3a21fc6b map;
  bool bVar2;
  uint32 length;
  uint32 size;
  DebugManager *this_00;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  ArenaAllocator *pAVar5;
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  DebugContext *this_03;
  ProbeContainer *this_04;
  DiagStackFrame **ppDVar6;
  JavascriptLibrary *pJVar7;
  bool local_121;
  DiagStackFrame *local_d0;
  DiagStackFrame *stackFrame;
  int frameIndex;
  int count;
  DiagStack *stackFrames;
  WeakDiagStack *framePointers;
  ScriptContext *tempScriptContext;
  undefined8 local_a0;
  TrackAllocData local_98;
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_70;
  DiagStackFrameList *stackList;
  undefined8 local_60;
  TrackAllocData local_58;
  void *local_30;
  DWORD_PTR dispatchHaltFrameAddress;
  ThreadContext *threadContext;
  JavascriptArray *stackTraceArray;
  ScriptContext *scriptContext_local;
  JsrtDebugStackFrames *this_local;
  
  threadContext = (ThreadContext *)0x0;
  stackTraceArray = (JavascriptArray *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  dispatchHaltFrameAddress = (DWORD_PTR)Js::ScriptContext::GetThreadContext(scriptContext);
  this_00 = ThreadContext::GetDebugManager((ThreadContext *)dispatchHaltFrameAddress);
  local_30 = (void *)Js::DebugManager::GetDispatchHaltFrameAddress(this_00);
  if (local_30 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                       ,0x36a,"(dispatchHaltFrameAddress > 0)",
                       "Didn\'t set the dispatchHaltFrameAddress at time of break?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (local_30 == (void *)0x0) {
    pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)stackTraceArray);
    threadContext = (ThreadContext *)Js::JavascriptLibrary::CreateArray(pJVar7,0,0);
  }
  else {
    if (this->framesDictionary == (FramesDictionary *)0x0) {
      pAVar4 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &JsUtil::
                  BaseDictionary<unsigned_int,JsrtDebuggerStackFrame*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                 ,0x370);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_58);
      stackList = (DiagStackFrameList *)Memory::ArenaAllocator::Alloc;
      local_60 = 0;
      this_01 = (BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar4,0x3f67b0);
      pAVar5 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
      JsUtil::
      BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,pAVar5,10);
      this->framesDictionary = this_01;
    }
    else {
      ClearFrameDictionary(this);
    }
    pAVar4 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,
               (type_info *)
               &JsUtil::
                List<Js::DiagStackFrame*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
               ,0x378);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_98);
    tempScriptContext = (ScriptContext *)Memory::ArenaAllocator::Alloc;
    local_a0 = 0;
    this_02 = (List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar4,0x3f67b0);
    pAVar5 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    JsUtil::
    List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_02,pAVar5,10);
    local_70 = this_02;
    framePointers =
         (WeakDiagStack *)
         ThreadContext::GetScriptContextList((ThreadContext *)dispatchHaltFrameAddress);
    while( true ) {
      local_121 = false;
      if (framePointers != (WeakDiagStack *)0x0) {
        local_121 = Js::ScriptContext::IsScriptContextInDebugMode((ScriptContext *)framePointers);
      }
      if (local_121 == false) break;
      this_03 = Js::ScriptContext::GetDebugContext((ScriptContext *)framePointers);
      this_04 = Js::DebugContext::GetProbeContainer(this_03);
      stackFrames = (DiagStack *)Js::ProbeContainer::GetFramePointers(this_04,(DWORD_PTR)local_30);
      if ((WeakDiagStack *)stackFrames != (WeakDiagStack *)0x0) {
        _frameIndex = Memory::
                      WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                      ::GetStrongReference
                                ((WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                                  *)stackFrames);
        if (_frameIndex !=
            (Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)0x0) {
          stackFrame._4_4_ =
               JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
               Count(_frameIndex);
          for (stackFrame._0_4_ = 0; (int)stackFrame < stackFrame._4_4_;
              stackFrame._0_4_ = (int)stackFrame + 1) {
            ppDVar6 = JsUtil::
                      Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
                      Peek(_frameIndex,(int)stackFrame);
            local_d0 = *ppDVar6;
            JsUtil::
            List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(local_70,&local_d0);
          }
        }
        Memory::
        WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
        ::ReleaseStrongReference
                  ((WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                    *)stackFrames);
        Memory::
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>>>
                  (&Memory::HeapAllocator::Instance,
                   (WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                    *)stackFrames);
      }
      framePointers = (WeakDiagStack *)framePointers[3].adapter;
    }
    JsUtil::
    List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Sort(local_70,DiagStackFrameSorter,local_30);
    pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)stackTraceArray);
    length = JsUtil::ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>::
             Count(&local_70->
                    super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                  );
    size = JsUtil::ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>::
           Count(&local_70->
                  super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>)
    ;
    threadContext = (ThreadContext *)Js::JavascriptLibrary::CreateArray(pJVar7,length,size);
    map.scriptContext = (ScriptContext **)&stackTraceArray;
    map.this = this;
    map.stackTraceArray = (JavascriptArray **)&threadContext;
    JsUtil::
    List<Js::DiagStackFrame*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
    Map<JsrtDebugStackFrames::StackFrames(Js::ScriptContext*)::__0>
              ((List<Js::DiagStackFrame*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)local_70,map);
    pAVar5 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::List<Js::DiagStackFrame*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
              (pAVar5,local_70);
  }
  return (JavascriptArray *)threadContext;
}

Assistant:

Js::JavascriptArray * JsrtDebugStackFrames::StackFrames(Js::ScriptContext * scriptContext)
{
    Js::JavascriptArray* stackTraceArray = nullptr;

    ThreadContext* threadContext = scriptContext->GetThreadContext();

    DWORD_PTR dispatchHaltFrameAddress = threadContext->GetDebugManager()->GetDispatchHaltFrameAddress();
    AssertMsg(dispatchHaltFrameAddress > 0, "Didn't set the dispatchHaltFrameAddress at time of break?");

    if (dispatchHaltFrameAddress != 0)
    {
        if (this->framesDictionary == nullptr)
        {
            this->framesDictionary = Anew(this->jsrtDebugManager->GetDebugObjectArena(), FramesDictionary, this->jsrtDebugManager->GetDebugObjectArena(), 10);
        }
        else
        {
            this->ClearFrameDictionary();
        }

        typedef JsUtil::List<Js::DiagStackFrame*, ArenaAllocator> DiagStackFrameList;
        DiagStackFrameList* stackList = Anew(this->jsrtDebugManager->GetDebugObjectArena(), DiagStackFrameList, this->jsrtDebugManager->GetDebugObjectArena(), 10);

        // Walk all the script contexts and collect the frames which are below the address when break was reported.
        for (Js::ScriptContext *tempScriptContext = threadContext->GetScriptContextList();
        tempScriptContext != nullptr && tempScriptContext->IsScriptContextInDebugMode();
            tempScriptContext = tempScriptContext->next)
        {
            Js::WeakDiagStack * framePointers = tempScriptContext->GetDebugContext()->GetProbeContainer()->GetFramePointers(dispatchHaltFrameAddress);
            if (framePointers != nullptr)
            {
                Js::DiagStack* stackFrames = framePointers->GetStrongReference();
                if (stackFrames != nullptr)
                {
                    int count = stackFrames->Count();
                    for (int frameIndex = 0; frameIndex < count; ++frameIndex)
                    {
                        Js::DiagStackFrame* stackFrame = stackFrames->Peek(frameIndex);
                        stackList->Add(stackFrame);
                    }
                }

                framePointers->ReleaseStrongReference();
                HeapDelete(framePointers);
            }
        }

        // Frames can be from multiple contexts, sort them based on stack address
        stackList->Sort(DiagStackFrameSorter, (void*)dispatchHaltFrameAddress);

        stackTraceArray = scriptContext->GetLibrary()->CreateArray(stackList->Count(), stackList->Count());

        stackList->Map([&](int index, Js::DiagStackFrame* stackFrame)
        {
            AssertMsg(index != 0 || stackFrame->IsTopFrame(), "Index 0 frame is not marked as top frame");
            Js::DynamicObject* stackTraceObject = this->GetStackFrame(stackFrame, index);
            Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, stackTraceObject);
            stackTraceArray->DirectSetItemAt(index, marshaledObj);
        });

        Adelete(this->jsrtDebugManager->GetDebugObjectArena(), stackList);
    }
    else
    {
        // Empty array
        stackTraceArray = scriptContext->GetLibrary()->CreateArray(0, 0);
    }

    return stackTraceArray;
}